

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths_unix.cpp
# Opt level: O1

bool checkXdgRuntimeDir(QString *xdgRuntimeDir)

{
  bool bVar1;
  __uid_t _Var2;
  int iVar3;
  int *piVar4;
  ushort *puVar5;
  QFileSystemMetaData *metaData_00;
  QFileSystemMetaData *metaData_01;
  bool bVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QFileSystemMetaData metaData;
  QFileSystemEntry entry;
  QByteArray QStack_f8;
  QByteArray local_e0;
  QMessageLogger local_c8;
  QFileSystemMetaData local_a8;
  undefined1 local_68 [64];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = geteuid();
  local_a8.knownFlagsMask.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  local_a8.entryFlags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
  super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
       (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)0x0;
  local_a8.size_ = -1;
  local_a8.accessTime_ = 0;
  local_a8.birthTime_ = 0;
  local_a8.metadataChangeTime_ = 0;
  local_a8.modificationTime_ = 0;
  local_a8.userId_ = 0xfffffffe;
  local_a8.groupId_ = 0xfffffffe;
  local_68._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)local_68,xdgRuntimeDir);
  QFileSystemEntry::nativeFilePath((NativePath *)&local_c8,(QFileSystemEntry *)local_68);
  pcVar7 = (char *)CONCAT44(local_c8.context.file._4_4_,local_c8.context.file._0_4_);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "";
  }
  iVar3 = mkdir(pcVar7,0x1c0);
  piVar4 = (int *)CONCAT44(local_c8.context.line,local_c8.context.version);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_c8.context.line,local_c8.context.version),1,0x10);
    }
  }
  bVar6 = true;
  if (iVar3 != 0) {
    piVar4 = __errno_location();
    if (*piVar4 == 0x11) {
      bVar1 = QFileSystemEngine::fillMetaData
                        ((QFileSystemEntry *)local_68,&local_a8,(MetaDataFlags)0x72a77077);
      if ((bVar1) || ((local_a8._0_8_ & 0x1000000000000) != 0)) {
        if (((uint)local_a8.entryFlags.
                   super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                   super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x50000) == 0x40000) {
          if (local_a8.userId_ == _Var2) {
            if (((uint)local_a8.entryFlags.
                       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                       super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i & 0x7777) == 0x7000)
            goto LAB_0044bb87;
            local_c8.context.version = 2;
            local_c8.context.line = 0;
            local_c8.context.file._0_4_ = 0;
            local_c8.context.file._4_4_ = 0;
            local_c8.context.function._0_4_ = 0;
            local_c8.context.function._4_4_ = 0;
            local_c8.context.category = "default";
            puVar5 = QString::utf16(xdgRuntimeDir);
            unixPermissionsText(&local_e0,
                                (Permissions)
                                ((uint)local_a8.entryFlags.
                                       super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>
                                       .super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i &
                                0x7777));
            unixPermissionsText(&QStack_f8,(Permissions)0x7000);
            if (local_e0.d.ptr == (char *)0x0) {
              local_e0.d.ptr = "";
            }
            if (QStack_f8.d.ptr == (char *)0x0) {
              QStack_f8.d.ptr = "";
            }
            QMessageLogger::warning
                      (&local_c8,
                       "QStandardPaths: wrong permissions on runtime directory %ls, %s instead of %s"
                       ,puVar5,local_e0.d.ptr,QStack_f8.d.ptr);
            checkXdgRuntimeDir();
          }
          else {
            local_c8.context.version = 2;
            local_c8.context.line = 0;
            local_c8.context.file._0_4_ = 0;
            local_c8.context.file._4_4_ = 0;
            local_c8.context.function._0_4_ = 0;
            local_c8.context.function._4_4_ = 0;
            local_c8.context.category = "default";
            puVar5 = QString::utf16(xdgRuntimeDir);
            checkXdgRuntimeDir::anon_class_1_0_00000001::operator()
                      (&local_e0,(anon_class_1_0_00000001 *)&local_a8,metaData_01);
            if (local_e0.d.ptr == (char *)0x0) {
              local_e0.d.ptr = "";
            }
            QMessageLogger::warning
                      (&local_c8,
                       "QStandardPaths: runtime directory \'%ls\' is not owned by UID %d, but %s",
                       puVar5,(ulong)_Var2,local_e0.d.ptr);
            checkXdgRuntimeDir();
          }
        }
        else {
          local_c8.context.version = 2;
          local_c8.context.line = 0;
          local_c8.context.file._0_4_ = 0;
          local_c8.context.file._4_4_ = 0;
          local_c8.context.function._0_4_ = 0;
          local_c8.context.function._4_4_ = 0;
          local_c8.context.category = "default";
          puVar5 = QString::utf16(xdgRuntimeDir);
          checkXdgRuntimeDir::anon_class_1_0_00000001::operator()
                    (&local_e0,(anon_class_1_0_00000001 *)&local_a8,metaData_00);
          if (local_e0.d.ptr == (char *)0x0) {
            local_e0.d.ptr = "";
          }
          QMessageLogger::warning
                    (&local_c8,
                     "QStandardPaths: runtime directory \'%ls\' is not a directory, but %s",puVar5,
                     local_e0.d.ptr);
          checkXdgRuntimeDir();
        }
        bVar6 = false;
        goto LAB_0044bb87;
      }
      puVar5 = QString::utf16(xdgRuntimeDir);
      pcVar7 = "QStandardPaths: error obtaining permissions of runtime directory \'%ls\'";
    }
    else {
      puVar5 = QString::utf16(xdgRuntimeDir);
      pcVar7 = "QStandardPaths: error creating runtime directory \'%ls\'";
    }
    bVar6 = false;
    qErrnoWarning(pcVar7,puVar5);
  }
LAB_0044bb87:
  if ((QArrayData *)local_68._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._24_8_,1,0x10);
    }
  }
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

static bool checkXdgRuntimeDir(const QString &xdgRuntimeDir)
{
    auto describeMetaData = [](const QFileSystemMetaData &metaData) -> QByteArray {
        if (!metaData.exists())
            return "a broken symlink";

        QByteArray description;
        if (metaData.isLink())
            description = "a symbolic link to ";

        if (metaData.isFile())
            description += "a regular file";
        else if (metaData.isDirectory())
            description += "a directory";
        else if (metaData.isSequential())
            description += "a character device, socket or FIFO";
        else
            description += "a block device";

        description += " permissions " + unixPermissionsText(metaData.permissions());

        return description
                + " owned by UID " + QByteArray::number(metaData.userId())
                + " GID " + QByteArray::number(metaData.groupId());
    };

    // http://standards.freedesktop.org/basedir-spec/latest/
    const uint myUid = uint(geteuid());
    const QFile::Permissions wantedPerms = QFile::ReadOwner | QFile::WriteOwner | QFile::ExeOwner;
    const QFileSystemMetaData::MetaDataFlags statFlags = QFileSystemMetaData::PosixStatFlags
                                                         | QFileSystemMetaData::LinkType;
    QFileSystemMetaData metaData;
    QFileSystemEntry entry(xdgRuntimeDir);

    // Check that the xdgRuntimeDir is a directory by attempting to create it.
    // A stat() before mkdir() that concluded it doesn't exist is a meaningless
    // result: we'd race against someone else attempting to create it.
    // ### QFileSystemEngine::createDirectory cannot take the extra mode argument.
    if (QT_MKDIR(entry.nativeFilePath(), 0700) == 0)
        return true;
    if (errno != EEXIST) {
        qErrnoWarning("QStandardPaths: error creating runtime directory '%ls'",
                      qUtf16Printable(xdgRuntimeDir));
        return false;
    }

    // We use LinkType to force an lstat(), but fillMetaData() still returns error
    // on broken symlinks.
    if (!QFileSystemEngine::fillMetaData(entry, metaData, statFlags) && !metaData.isLink()) {
        qErrnoWarning("QStandardPaths: error obtaining permissions of runtime directory '%ls'",
                      qUtf16Printable(xdgRuntimeDir));
        return false;
    }

    // Checks:
    // - is a directory
    // - is not a symlink (even is pointing to a directory)
    if (metaData.isLink() || !metaData.isDirectory()) {
        qWarning("QStandardPaths: runtime directory '%ls' is not a directory, but %s",
                 qUtf16Printable(xdgRuntimeDir), describeMetaData(metaData).constData());
        return false;
    }

    // - "The directory MUST be owned by the user"
    if (metaData.userId() != myUid) {
        qWarning("QStandardPaths: runtime directory '%ls' is not owned by UID %d, but %s",
                 qUtf16Printable(xdgRuntimeDir), myUid, describeMetaData(metaData).constData());
        return false;
    }

    // "and he MUST be the only one having read and write access to it. Its Unix access mode MUST be 0700."
    if (metaData.permissions() != wantedPerms) {
        qWarning("QStandardPaths: wrong permissions on runtime directory %ls, %s instead of %s",
                 qUtf16Printable(xdgRuntimeDir),
                 unixPermissionsText(metaData.permissions()).constData(),
                 unixPermissionsText(wantedPerms).constData());
        return false;
    }

    return true;
}